

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

string * __thiscall
polyscope::SurfaceOneFormTangentVectorQuantity::niceName_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceOneFormTangentVectorQuantity *this)

{
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_SurfaceVectorQuantity).field_0x148," (1-form tangent vector)");
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceOneFormTangentVectorQuantity::niceName() { return name + " (1-form tangent vector)"; }